

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O3

void llvm::DWARFYAML::EmitDebugAranges(raw_ostream *OS,Data *DI)

{
  pointer pAVar1;
  char *pcVar2;
  char *pcVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  ushort uVar6;
  pointer pAVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t __n;
  ulong uVar10;
  pointer pAVar11;
  pointer pAVar12;
  undefined1 auStack_78 [8];
  ARange Range;
  uint local_34;
  
  pAVar11 = (DI->ARanges).
            super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (DI->ARanges).
           super__Vector_base<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pAVar11 == pAVar1) {
      return;
    }
    auStack_78._0_4_ = (pAVar11->Length).TotalLength;
    auStack_78._4_4_ = *(undefined4 *)&(pAVar11->Length).field_0x4;
    uVar4 = (pAVar11->Length).TotalLength64;
    uVar5 = *(undefined8 *)&pAVar11->field_0x12;
    Range.Length.TotalLength64._0_2_ =
         (ushort)((ulong)*(undefined8 *)((long)&(pAVar11->Length).TotalLength64 + 2) >> 0x30);
    Range.Length.TotalLength64._2_2_ = (undefined2)uVar5;
    Range.Length.TotalLength64._4_4_ = (uint)((ulong)uVar5 >> 0x10);
    Range.Version._0_1_ = (byte)((ulong)uVar5 >> 0x30);
    Range.Version._1_1_ = (undefined1)((ulong)uVar5 >> 0x38);
    Range.Length.TotalLength._0_2_ = (undefined2)uVar4;
    Range.Length._2_6_ = SUB86(uVar4 >> 0x10,0);
    std::
    vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>::
    vector((vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
            *)&Range.AddrSize,&pAVar11->Descriptors);
    iVar8 = (*OS->_vptr_raw_ostream[9])(OS);
    pcVar2 = OS->OutBufStart;
    pcVar3 = OS->OutBufCur;
    writeInitialLength((InitialLength *)auStack_78,OS,DI->IsLittleEndian);
    uVar6 = (ushort)Range.Length.TotalLength64 << 8 | (ushort)Range.Length.TotalLength64 >> 8;
    if (DI->IsLittleEndian != false) {
      uVar6 = (ushort)Range.Length.TotalLength64;
    }
    local_34 = CONCAT22(local_34._2_2_,uVar6);
    raw_ostream::write(OS,(int)&local_34,(void *)0x2,
                       (ulong)CONCAT22(Range.Length.TotalLength64._2_2_,uVar6));
    local_34 = Range.Length.TotalLength64._4_4_ >> 0x18 |
               (Range.Length.TotalLength64._4_4_ & 0xff0000) >> 8 |
               (Range.Length.TotalLength64._4_4_ & 0xff00) << 8 |
               Range.Length.TotalLength64._4_4_ << 0x18;
    if (DI->IsLittleEndian != false) {
      local_34 = Range.Length.TotalLength64._4_4_;
    }
    __n = (size_t)local_34;
    raw_ostream::write(OS,(int)&local_34,(void *)0x4,__n);
    local_34._0_1_ = (byte)Range.Version;
    raw_ostream::write(OS,(int)&local_34,(void *)0x1,__n);
    local_34 = CONCAT31(local_34._1_3_,Range.Version._1_1_);
    raw_ostream::write(OS,(int)&local_34,(void *)0x1,__n);
    iVar9 = (*OS->_vptr_raw_ostream[9])(OS);
    if ((byte)Range.Version == 0) break;
    uVar10 = (ulong)((uint)(byte)Range.Version * 2);
    ZeroFillBytes(OS,(uVar10 - (ulong)(OS->OutBufCur +
                                      (long)(pcVar2 + uVar10 + ((CONCAT44(extraout_var_00,iVar9) -
                                                                (long)(pcVar3 + CONCAT44(
                                                  extraout_var,iVar8))) - (long)OS->OutBufStart) +
                                                  -1)) % uVar10) - 1);
    pAVar7 = Range.Descriptors.
             super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (pAVar12 = (pointer)Range._24_8_; pAVar12 != pAVar7; pAVar12 = pAVar12 + 1) {
      uVar4 = pAVar12->Length;
      writeVariableSizedInteger
                ((pAVar12->Address).value,(ulong)(byte)Range.Version,OS,DI->IsLittleEndian);
      writeVariableSizedInteger(uVar4,(ulong)(byte)Range.Version,OS,DI->IsLittleEndian);
    }
    ZeroFillBytes(OS,(ulong)((uint)(byte)Range.Version * 2));
    if (Range._24_8_ != 0) {
      operator_delete((void *)Range._24_8_,
                      (long)Range.Descriptors.
                            super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
                            ._M_impl.super__Vector_impl_data._M_finish - Range._24_8_);
    }
    pAVar11 = pAVar11 + 1;
  }
  __assert_fail("Align != 0u && \"Align can\'t be 0.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/MathExtras.h"
                ,0x2ce,"uint64_t llvm::alignTo(uint64_t, uint64_t, uint64_t)");
}

Assistant:

void DWARFYAML::EmitDebugAranges(raw_ostream &OS, const DWARFYAML::Data &DI) {
  for (auto Range : DI.ARanges) {
    auto HeaderStart = OS.tell();
    writeInitialLength(Range.Length, OS, DI.IsLittleEndian);
    writeInteger((uint16_t)Range.Version, OS, DI.IsLittleEndian);
    writeInteger((uint32_t)Range.CuOffset, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)Range.AddrSize, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)Range.SegSize, OS, DI.IsLittleEndian);

    auto HeaderSize = OS.tell() - HeaderStart;
    auto FirstDescriptor = alignTo(HeaderSize, Range.AddrSize * 2);
    ZeroFillBytes(OS, FirstDescriptor - HeaderSize);

    for (auto Descriptor : Range.Descriptors) {
      writeVariableSizedInteger(Descriptor.Address, Range.AddrSize, OS,
                                DI.IsLittleEndian);
      writeVariableSizedInteger(Descriptor.Length, Range.AddrSize, OS,
                                DI.IsLittleEndian);
    }
    ZeroFillBytes(OS, Range.AddrSize * 2);
  }
}